

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

bool __thiscall
opts::BasicOption::parse(BasicOption *this,int argc,char **argv,int *i,int j,IsShort *is_short)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  allocator local_71;
  string local_70 [32];
  function<bool_(char)> local_50;
  
  lVar5 = (long)*i;
  pcVar7 = argv[lVar5];
  pcVar6 = pcVar7 + j;
  if (pcVar7[j] == '=') {
    pcVar6 = pcVar6 + 1;
LAB_00127eb0:
    std::__cxx11::string::string(local_70,pcVar6,&local_71);
    iVar2 = (*this->_vptr_BasicOption[4])(this,local_70);
    std::__cxx11::string::~string(local_70);
    if ((char)iVar2 != '\0') {
      return true;
    }
    poVar4 = std::operator<<((ostream *)&std::cerr,"error: failed to parse ");
    poVar4 = std::operator<<(poVar4,pcVar6);
    poVar4 = std::operator<<(poVar4," in ");
  }
  else {
    if (pcVar7[j] == '\0') {
      lVar3 = lVar5 + 1;
      if ((int)lVar3 < argc) {
        pcVar6 = argv[lVar5 + 1];
        if (*pcVar6 == '-') {
          std::function<bool_(char)>::function(&local_50,is_short);
          bVar1 = Options::dashed_non_option(pcVar6,&local_50);
          std::_Function_base::~_Function_base(&local_50.super__Function_base);
          if (!bVar1) goto LAB_00127f1d;
          lVar3 = (long)*i + 1;
        }
        *i = (int)lVar3;
        pcVar6 = argv[lVar3];
        goto LAB_00127eb0;
      }
LAB_00127f1d:
      poVar4 = (ostream *)&std::cerr;
      pcVar6 = "error: cannot find the argument; ignoring ";
    }
    else {
      if (j == 2) goto LAB_00127eb0;
      poVar4 = std::operator<<((ostream *)&std::cerr,"error: unexpected character \'");
      poVar4 = std::operator<<(poVar4,argv[*i][j]);
      pcVar6 = "\' ignoring ";
    }
    poVar4 = std::operator<<(poVar4,pcVar6);
    pcVar7 = argv[*i];
  }
  poVar4 = std::operator<<(poVar4,pcVar7);
  std::operator<<(poVar4,'\n');
  return false;
}

Assistant:

bool
BasicOption::parse(int argc, char** argv, int& i, int j, IsShort is_short)
{
    char* argument;
    char* cur_arg = argv[i];
    // -v...
    if (argv[i][j] == '\0')
    {
        // -v data
        if (i + 1 < argc && (argv[i+1][0] != '-' || Options::dashed_non_option(argv[i+1], is_short)))
        {
            ++i;
            argument = argv[i];
        } else
        {
            std::cerr << "error: cannot find the argument; ignoring " << argv[i] << '\n';
            return false;
        }
    } else if (argv[i][j] == '=')
    {
        // -v=data
        argument = &argv[i][j+1];
    } else if( j == 2 ) { // only for short options
        // -vdata
        argument = &argv[i][j];
    } else
    {
        std::cerr << "error: unexpected character \'" << argv[i][j] << "\' ignoring " << argv[i] << '\n';
        return false;
    }
    bool result = set(argument);
    if (!result)
        std::cerr << "error: failed to parse " << argument << " in " << cur_arg << '\n';
    return result;
}